

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::MILSpec::Value::MergeFrom(Value *this,Value *from)

{
  ulong uVar1;
  LogMessage *other;
  ValueType *this_00;
  Value_ImmediateValue *this_01;
  Value_BlobFileValue *this_02;
  undefined8 *puVar2;
  ulong uVar3;
  undefined1 *puVar4;
  Arena *pAVar5;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O3/mlmodel/format/MIL.pb.cc"
               ,0x17fc);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  uVar3 = (ulong)(from->docstring_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar3 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&this->docstring_,uVar3,puVar2);
  }
  puVar4 = (undefined1 *)from->type_;
  if ((ValueType *)puVar4 != (ValueType *)0x0 && from != (Value *)_Value_default_instance_) {
    this_00 = this->type_;
    if (this_00 == (ValueType *)0x0) {
      uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar5 = (Arena *)(uVar3 & 0xfffffffffffffffc);
      if ((uVar3 & 1) != 0) {
        pAVar5 = *(Arena **)pAVar5;
      }
      this_00 = google::protobuf::Arena::
                CreateMaybeMessage<CoreML::Specification::MILSpec::ValueType>(pAVar5);
      this->type_ = this_00;
      puVar4 = (undefined1 *)from->type_;
    }
    if ((ValueType *)puVar4 == (ValueType *)0x0) {
      puVar4 = _ValueType_default_instance_;
    }
    ValueType::MergeFrom(this_00,(ValueType *)puVar4);
  }
  if (from->_oneof_case_[0] != 5) {
    if (from->_oneof_case_[0] != 3) goto LAB_00203c73;
    if (this->_oneof_case_[0] == 3) {
      this_01 = (this->value_).immediatevalue_;
LAB_00203c1c:
      puVar4 = (undefined1 *)(from->value_).immediatevalue_;
    }
    else {
      clear_value(this);
      this->_oneof_case_[0] = 3;
      uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar5 = (Arena *)(uVar3 & 0xfffffffffffffffc);
      if ((uVar3 & 1) != 0) {
        pAVar5 = *(Arena **)pAVar5;
      }
      this_01 = google::protobuf::Arena::
                CreateMaybeMessage<CoreML::Specification::MILSpec::Value_ImmediateValue>(pAVar5);
      (this->value_).immediatevalue_ = this_01;
      if (from->_oneof_case_[0] == 3) goto LAB_00203c1c;
      puVar4 = _Value_ImmediateValue_default_instance_;
    }
    Value_ImmediateValue::MergeFrom(this_01,(Value_ImmediateValue *)puVar4);
    goto LAB_00203c73;
  }
  if (this->_oneof_case_[0] == 5) {
    this_02 = (this->value_).blobfilevalue_;
LAB_00203c53:
    puVar4 = (undefined1 *)(from->value_).blobfilevalue_;
  }
  else {
    clear_value(this);
    this->_oneof_case_[0] = 5;
    uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar5 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar5 = *(Arena **)pAVar5;
    }
    this_02 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::MILSpec::Value_BlobFileValue>(pAVar5);
    (this->value_).blobfilevalue_ = this_02;
    if (from->_oneof_case_[0] == 5) goto LAB_00203c53;
    puVar4 = _Value_BlobFileValue_default_instance_;
  }
  Value_BlobFileValue::MergeFrom(this_02,(Value_BlobFileValue *)puVar4);
LAB_00203c73:
  uVar3 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar3 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

void Value::MergeFrom(const Value& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.MILSpec.Value)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (!from._internal_docstring().empty()) {
    _internal_set_docstring(from._internal_docstring());
  }
  if (from._internal_has_type()) {
    _internal_mutable_type()->::CoreML::Specification::MILSpec::ValueType::MergeFrom(from._internal_type());
  }
  switch (from.value_case()) {
    case kImmediateValue: {
      _internal_mutable_immediatevalue()->::CoreML::Specification::MILSpec::Value_ImmediateValue::MergeFrom(from._internal_immediatevalue());
      break;
    }
    case kBlobFileValue: {
      _internal_mutable_blobfilevalue()->::CoreML::Specification::MILSpec::Value_BlobFileValue::MergeFrom(from._internal_blobfilevalue());
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}